

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_GLSL_attribute(Context *ctx,RegisterType regtype,int regnum,MOJOSHADER_usage usage,
                        int index,int wmask,int flags)

{
  int iVar1;
  RegisterType RVar2;
  char *pcVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  char *pcVar7;
  undefined4 in_register_00000084;
  ulong uVar8;
  char *pcVar9;
  char index_str [16];
  char var [64];
  char regnum_str [16];
  ulong local_98 [2];
  char local_88 [64];
  char local_48 [24];
  
  local_98[0] = 0;
  local_98[1] = 0;
  pcVar3 = get_D3D_register_string(ctx,regtype,regnum,local_48,CONCAT44(in_register_00000084,index))
  ;
  snprintf(local_88,0x40,"%s_%s%s",ctx->shader_type_str,pcVar3,local_48);
  if (index != 0) {
    snprintf((char *)local_98,0x10,"%u",(ulong)(uint)index);
  }
  if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
    if ((flags & 4U) != 0) {
      pcVar3 = ctx->profile->name;
      pcVar7 = "centroid unsupported in %s profile";
      goto LAB_0010e097;
    }
    pcVar3 = "";
    if (regtype == REG_TYPE_DEPTHOUT) {
      pcVar7 = "gl_FragDepth";
LAB_0010e35f:
      pcVar9 = "";
    }
    else {
      if (regtype != REG_TYPE_COLOROUT) {
        if ((regtype & ~REG_TYPE_CONST) == REG_TYPE_INPUT) {
          if (usage == MOJOSHADER_USAGE_COLOR) {
            local_98[0] = (ulong)local_98[0]._1_7_ << 8;
            if (index == 1) {
              iVar1 = ctx->profile_supports_glsles;
              pcVar9 = "gl_SecondaryColor";
              pcVar7 = "v_FrontSecondaryColor";
            }
            else {
              if (index != 0) goto LAB_0010e27d;
              iVar1 = ctx->profile_supports_glsles;
              pcVar9 = "gl_Color";
              pcVar7 = "v_FrontColor";
            }
            if (iVar1 == 0) {
              pcVar7 = pcVar9;
            }
          }
          else {
            if (usage == MOJOSHADER_USAGE_TEXCOORD) {
              bVar5 = ctx->minor_ver;
              if (bVar5 == 0xff) {
                bVar5 = 0;
              }
              pcVar7 = (char *)0x0;
              if (((uint)bVar5 | (uint)ctx->major_ver << 0x10) < 0x10004) goto LAB_0010e35f;
              snprintf((char *)local_98,0x10,"%u",(ulong)(uint)index);
              pcVar7 = "v_TexCoord";
              if (ctx->profile_supports_glsles == 0) {
                pcVar7 = "gl_TexCoord";
              }
              pcVar9 = "]";
              pcVar3 = "[";
              goto LAB_0010e362;
            }
LAB_0010e27d:
            pcVar7 = (char *)0x0;
          }
        }
        else if (regtype == REG_TYPE_MISCTYPE) {
          if (regnum == 0) {
            local_98[0] = (ulong)local_98[0]._1_7_ << 8;
            pcVar7 = "gl_FragCoord";
          }
          else {
            if (regnum != 1) {
              pcVar9 = "BUG: unhandled misc register";
              goto LAB_0010e337;
            }
            push_output(ctx,&ctx->globals);
            pcVar7 = (char *)0x0;
            output_line(ctx,"float %s = gl_FrontFacing ? 1.0 : -1.0;",local_88);
            pop_output(ctx);
          }
        }
        else {
          pcVar9 = "unknown pixel shader attribute register";
LAB_0010e337:
          pcVar7 = (char *)0x0;
          failf(ctx,"%s",pcVar9);
        }
        goto LAB_0010e35f;
      }
      if (ctx->have_multi_color_outputs == 0) {
        pcVar7 = "gl_FragColor";
        goto LAB_0010e35f;
      }
      snprintf((char *)local_98,0x10,"%u",(ulong)(uint)regnum);
      pcVar9 = "]";
      pcVar3 = "[";
      pcVar7 = "gl_FragData";
    }
LAB_0010e362:
    push_output(ctx,&ctx->globals);
    if (pcVar7 == (char *)0x0) {
      pcVar3 = "varying highp vec4 io_%i_%i;";
      if (ctx->profile_supports_glsles == 0) {
        pcVar3 = "varying vec4 io_%i_%i;";
      }
      output_line(ctx,pcVar3,(ulong)(uint)usage,(ulong)(uint)index);
      uVar6 = (ulong)(uint)usage;
      uVar8 = (ulong)(uint)index;
LAB_0010e3d6:
      output_line(ctx,"#define %s io_%i_%i",local_88,uVar6,uVar8);
      goto LAB_0010e3dd;
    }
  }
  else {
    if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) {
      pcVar7 = "%s";
      pcVar3 = "Unknown shader type";
LAB_0010e097:
      failf(ctx,pcVar7,pcVar3);
      return;
    }
    if (ctx->major_ver < 3) {
      if (regtype == REG_TYPE_OUTPUT) {
        usage = MOJOSHADER_USAGE_TEXCOORD;
        index = regnum;
      }
      else {
        RVar2 = REG_TYPE_OUTPUT;
        if (regtype == REG_TYPE_ATTROUT) {
          usage = MOJOSHADER_USAGE_COLOR;
          index = regnum;
          regtype = RVar2;
        }
        else if ((regtype == REG_TYPE_RASTOUT) &&
                (index = regnum, regtype = RVar2, (uint)regnum < 3)) {
          usage = *(MOJOSHADER_usage *)(&DAT_00152b8c + (ulong)(uint)regnum * 4);
        }
      }
    }
    if (regtype != REG_TYPE_OUTPUT) {
      if (regtype != REG_TYPE_INPUT) {
        pcVar7 = "%s";
        pcVar3 = "unknown vertex shader attribute register";
        goto LAB_0010e097;
      }
      push_output(ctx,&ctx->globals);
      output_line(ctx,"attribute vec4 %s;",local_88);
      goto LAB_0010e3dd;
    }
    pcVar3 = "";
    pcVar7 = (char *)0x0;
    switch(usage) {
    case MOJOSHADER_USAGE_POSITION:
      pcVar7 = "gl_Position";
      break;
    case MOJOSHADER_USAGE_POINTSIZE:
      pcVar7 = "gl_PointSize";
      break;
    case MOJOSHADER_USAGE_TEXCOORD:
      snprintf((char *)local_98,0x10,"%u",(ulong)(uint)index);
      pcVar7 = "v_TexCoord";
      if (ctx->profile_supports_glsles == 0) {
        pcVar7 = "gl_TexCoord";
      }
      pcVar9 = "]";
      pcVar3 = "[";
      goto LAB_0010e2a6;
    case MOJOSHADER_USAGE_COLOR:
      local_98[0] = local_98[0] & 0xffffffffffffff00;
      if (index == 1) {
        iVar1 = ctx->profile_supports_glsles;
        pcVar9 = "gl_FrontSecondaryColor";
        pcVar7 = "v_FrontSecondaryColor";
      }
      else {
        if (index != 0) {
          pcVar7 = (char *)0x0;
          break;
        }
        iVar1 = ctx->profile_supports_glsles;
        pcVar9 = "gl_FrontColor";
        pcVar7 = "v_FrontColor";
      }
      if (iVar1 == 0) {
        pcVar7 = pcVar9;
      }
      break;
    case MOJOSHADER_USAGE_FOG:
      pcVar7 = "gl_FogFragCoord";
    }
    pcVar9 = "";
LAB_0010e2a6:
    push_output(ctx,&ctx->globals);
    if (pcVar7 == (char *)0x0) {
      pcVar3 = "varying highp vec4 io_%i_%i;";
      if (ctx->profile_supports_glsles == 0) {
        pcVar3 = "varying vec4 io_%i_%i;";
      }
      output_line(ctx,pcVar3,(ulong)(uint)usage,(ulong)(uint)index);
      uVar6 = (ulong)(uint)usage;
      uVar8 = (ulong)(uint)index;
      goto LAB_0010e3d6;
    }
  }
  output_line(ctx,"#define %s %s%s%s%s",local_88,pcVar7,pcVar3,local_98,pcVar9);
LAB_0010e3dd:
  lVar4 = (long)ctx->output_stack_len;
  if (0 < lVar4) {
    ctx->output_stack_len = (int)(lVar4 - 1U);
    ctx->output = ctx->output_stack[lVar4 - 1U & 0xffffffff];
    ctx->indent = ctx->indent_stack[lVar4 + -1];
    return;
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_GLSL_attribute(Context *ctx, RegisterType regtype, int regnum,
                                MOJOSHADER_usage usage, int index, int wmask,
                                int flags)
{
    // !!! FIXME: this function doesn't deal with write masks at all yet!
    const char *usage_str = NULL;
    const char *arrayleft = "";
    const char *arrayright = "";
    char index_str[16] = { '\0' };
    char var[64];

    get_GLSL_varname_in_buf(ctx, regtype, regnum, var, sizeof (var));

    //assert((flags & MOD_PP) == 0);  // !!! FIXME: is PP allowed?

    if (index != 0)  // !!! FIXME: a lot of these MUST be zero.
        snprintf(index_str, sizeof (index_str), "%u", (uint) index);

    if (shader_is_vertex(ctx))
    {
        // pre-vs3 output registers.
        // these don't ever happen in DCL opcodes, I think. Map to vs_3_*
        //  output registers.
        if (!shader_version_atleast(ctx, 3, 0))
        {
            if (regtype == REG_TYPE_RASTOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                index = regnum;
                switch ((const RastOutType) regnum)
                {
                    case RASTOUT_TYPE_POSITION:
                        usage = MOJOSHADER_USAGE_POSITION;
                        break;
                    case RASTOUT_TYPE_FOG:
                        usage = MOJOSHADER_USAGE_FOG;
                        break;
                    case RASTOUT_TYPE_POINT_SIZE:
                        usage = MOJOSHADER_USAGE_POINTSIZE;
                        break;
                } // switch
            } // if

            else if (regtype == REG_TYPE_ATTROUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_COLOR;
                index = regnum;
            } // else if

            else if (regtype == REG_TYPE_TEXCRDOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_TEXCOORD;
                index = regnum;
            } // else if
        } // if

        // to avoid limitations of various GL entry points for input
        // attributes (glSecondaryColorPointer() can only take 3 component
        // items, glVertexPointer() can't do GL_UNSIGNED_BYTE, many other
        // issues), we set up all inputs as generic vertex attributes, so we
        // can pass data in just about any form, and ignore the built-in GLSL
        // attributes like gl_SecondaryColor. Output needs to use the the
        // built-ins, though, but we don't have to worry about the GL entry
        // point limitations there.

        if (regtype == REG_TYPE_INPUT)
        {
            push_output(ctx, &ctx->globals);
            output_line(ctx, "attribute vec4 %s;", var);
            pop_output(ctx);
        } // if

        else if (regtype == REG_TYPE_OUTPUT)
        {
            switch (usage)
            {
                case MOJOSHADER_USAGE_POSITION:
                    usage_str = "gl_Position";
                    break;
                case MOJOSHADER_USAGE_POINTSIZE:
                    usage_str = "gl_PointSize";
                    break;
                case MOJOSHADER_USAGE_COLOR:
                    index_str[0] = '\0';  // no explicit number.
                    if (index == 0)
                    {
#if SUPPORT_PROFILE_GLSLES
                        if (support_glsles(ctx))
                            usage_str = "v_FrontColor";
                        else
#endif
                        usage_str = "gl_FrontColor";
                    } // if
                    else if (index == 1)
                    {
#if SUPPORT_PROFILE_GLSLES
                        if (support_glsles(ctx))
                            usage_str = "v_FrontSecondaryColor";
                        else
#endif
                        usage_str = "gl_FrontSecondaryColor";
                    } // else if
                    break;
                case MOJOSHADER_USAGE_FOG:
                    usage_str = "gl_FogFragCoord";
                    break;
                case MOJOSHADER_USAGE_TEXCOORD:
                    snprintf(index_str, sizeof (index_str), "%u", (uint) index);
#if SUPPORT_PROFILE_GLSLES
                    if (support_glsles(ctx))
                        usage_str = "v_TexCoord";
                    else
#endif
                    usage_str = "gl_TexCoord";
                    arrayleft = "[";
                    arrayright = "]";
                    break;
                default:
                    // !!! FIXME: we need to deal with some more built-in varyings here.
                    break;
            } // switch

            // !!! FIXME: the #define is a little hacky, but it means we don't
            // !!! FIXME:  have to track these separately if this works.
            push_output(ctx, &ctx->globals);
            // no mapping to built-in var? Just make it a regular global, pray.
            if (usage_str == NULL)
            {
#if SUPPORT_PROFILE_GLSLES
                if (support_glsles(ctx))
                    output_line(ctx, "varying highp vec4 io_%i_%i;", usage, index);
                else
#endif
                output_line(ctx, "varying vec4 io_%i_%i;", usage, index);
                output_line(ctx, "#define %s io_%i_%i", var, usage, index);
            } // if
            else
            {
                output_line(ctx, "#define %s %s%s%s%s", var, usage_str,
                            arrayleft, index_str, arrayright);
            } // else
            pop_output(ctx);
        } // else if

        else
        {
            fail(ctx, "unknown vertex shader attribute register");
        } // else
    } // if

    else if (shader_is_pixel(ctx))
    {
        // samplers DCLs get handled in emit_GLSL_sampler().

        if (flags & MOD_CENTROID)  // !!! FIXME
        {
            failf(ctx, "centroid unsupported in %s profile", ctx->profile->name);
            return;
        } // if

        if (regtype == REG_TYPE_COLOROUT)
        {
            if (!ctx->have_multi_color_outputs)
                usage_str = "gl_FragColor";  // maybe faster?
            else
            {
                snprintf(index_str, sizeof (index_str), "%u", (uint) regnum);
                usage_str = "gl_FragData";
                arrayleft = "[";
                arrayright = "]";
            } // else
        } // if

        else if (regtype == REG_TYPE_DEPTHOUT)
            usage_str = "gl_FragDepth";

        // !!! FIXME: can you actualy have a texture register with COLOR usage?
        else if ((regtype == REG_TYPE_TEXTURE) || (regtype == REG_TYPE_INPUT))
        {
            if (usage == MOJOSHADER_USAGE_TEXCOORD)
            {
                // ps_1_1 does a different hack for this attribute.
                //  Refer to emit_GLSL_global()'s REG_TYPE_ADDRESS code.
                if (shader_version_atleast(ctx, 1, 4))
                {
                    snprintf(index_str, sizeof (index_str), "%u", (uint) index);
#if SUPPORT_PROFILE_GLSLES
                    if (support_glsles(ctx))
                        usage_str = "v_TexCoord";
                    else
#endif
                    usage_str = "gl_TexCoord";
                    arrayleft = "[";
                    arrayright = "]";
                } // if
            } // if

            else if (usage == MOJOSHADER_USAGE_COLOR)
            {
                index_str[0] = '\0';  // no explicit number.
                if (index == 0)
                {
#if SUPPORT_PROFILE_GLSLES
                    if (support_glsles(ctx))
                        usage_str = "v_FrontColor";
                    else
#endif
                    usage_str = "gl_Color";
                } // if
                else if (index == 1)
                {
#if SUPPORT_PROFILE_GLSLES
                    if (support_glsles(ctx))
                        usage_str = "v_FrontSecondaryColor";
                    else
#endif
                    usage_str = "gl_SecondaryColor";
                } // else if
                // FIXME: Does this even matter when we have varyings? -flibit
                // else
                //    fail(ctx, "unsupported color index");
            } // else if
        } // else if

        else if (regtype == REG_TYPE_MISCTYPE)
        {
            const MiscTypeType mt = (MiscTypeType) regnum;
            if (mt == MISCTYPE_TYPE_FACE)
            {
                push_output(ctx, &ctx->globals);
                output_line(ctx, "float %s = gl_FrontFacing ? 1.0 : -1.0;", var);
                pop_output(ctx);
            } // if
            else if (mt == MISCTYPE_TYPE_POSITION)
            {
                index_str[0] = '\0';  // no explicit number.
                usage_str = "gl_FragCoord";  // !!! FIXME: is this the same coord space as D3D?
            } // else if
            else
            {
                fail(ctx, "BUG: unhandled misc register");
            } // else
        } // else if

        else
        {
            fail(ctx, "unknown pixel shader attribute register");
        } // else

        push_output(ctx, &ctx->globals);
        // no mapping to built-in var? Just make it a regular global, pray.
        if (usage_str == NULL)
        {
#if SUPPORT_PROFILE_GLSLES
            if (support_glsles(ctx))
                output_line(ctx, "varying highp vec4 io_%i_%i;", usage, index);
            else
#endif
            output_line(ctx, "varying vec4 io_%i_%i;", usage, index);
            output_line(ctx, "#define %s io_%i_%i", var, usage, index);
        } // if
        else
        {
            output_line(ctx, "#define %s %s%s%s%s", var, usage_str,
                        arrayleft, index_str, arrayright);
        } // else
        pop_output(ctx);
    } // else if

    else
    {
        fail(ctx, "Unknown shader type");  // state machine should catch this.
    } // else
}